

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool ppk_loadpub_f(Filename *filename,char **algorithm,BinarySink *bs,char **commentptr,
                   char **errorstr)

{
  LoadedFile *lf_00;
  _Bool toret;
  LoadedFile *lf;
  char **errorstr_local;
  char **commentptr_local;
  BinarySink *bs_local;
  char **algorithm_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,errorstr);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    filename_local._7_1_ = ppk_loadpub_s(lf_00->binarysource_,algorithm,bs,commentptr,errorstr);
    lf_free(lf_00);
  }
  return filename_local._7_1_;
}

Assistant:

bool ppk_loadpub_f(const Filename *filename, char **algorithm, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errorstr);
    if (!lf)
        return false;

    bool toret = ppk_loadpub_s(BinarySource_UPCAST(lf), algorithm, bs,
                               commentptr, errorstr);
    lf_free(lf);
    return toret;
}